

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkLocation(TParseContext *this,TSourceLoc *loc,TOperator op)

{
  TInterlockOrdering TVar1;
  TOperator op_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (op == EOpBarrier) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"tessellation control barrier() cannot be placed within flow control",""
                  );
      }
      if ((this->inMain & 1U) == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"tessellation control barrier() must be in main()","");
      }
      else if (((this->super_TParseContextBase).postEntryPointReturn & 1U) != 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "tessellation control barrier() cannot be placed after a return from main()","");
      }
    }
  }
  else if (op == EOpBeginInvocationInterlock) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() must be in a fragment shader","");
    }
    if ((this->inMain & 1U) == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() must be in main()","");
    }
    else if (((this->super_TParseContextBase).postEntryPointReturn & 1U) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "beginInvocationInterlockARB() cannot be placed after a return from main()","");
    }
    if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() cannot be placed within flow control","");
    }
    if (0 < (this->super_TParseContextBase).beginInvocationInterlockCount) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"beginInvocationInterlockARB() must only be called once","");
    }
    if (0 < (this->super_TParseContextBase).endInvocationInterlockCount) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()",
                 "");
    }
    (this->super_TParseContextBase).beginInvocationInterlockCount =
         (this->super_TParseContextBase).beginInvocationInterlockCount + 1;
    TVar1 = TIntermediate::getInterlockOrdering
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if (TVar1 == EioNone) {
      TIntermediate::setInterlockOrdering
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 EioPixelInterlockOrdered);
    }
  }
  else if (op == EOpEndInvocationInterlock) {
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"endInvocationInterlockARB() must be in a fragment shader","");
    }
    if ((this->inMain & 1U) == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"endInvocationInterlockARB() must be in main()","");
    }
    else if (((this->super_TParseContextBase).postEntryPointReturn & 1U) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"endInvocationInterlockARB() cannot be placed after a return from main()",
                 "");
    }
    if (0 < (this->super_TParseContextBase).controlFlowNestingLevel) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"endInvocationInterlockARB() cannot be placed within flow control","");
    }
    if (0 < (this->super_TParseContextBase).endInvocationInterlockCount) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"endInvocationInterlockARB() must only be called once","");
    }
    if ((this->super_TParseContextBase).beginInvocationInterlockCount == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()",
                 "");
    }
    (this->super_TParseContextBase).endInvocationInterlockCount =
         (this->super_TParseContextBase).endInvocationInterlockCount + 1;
  }
  return;
}

Assistant:

void TParseContext::checkLocation(const TSourceLoc& loc, TOperator op)
{
    switch (op) {
    case EOpBarrier:
        if (language == EShLangTessControl) {
            if (controlFlowNestingLevel > 0)
                error(loc, "tessellation control barrier() cannot be placed within flow control", "", "");
            if (! inMain)
                error(loc, "tessellation control barrier() must be in main()", "", "");
            else if (postEntryPointReturn)
                error(loc, "tessellation control barrier() cannot be placed after a return from main()", "", "");
        }
        break;
    case EOpBeginInvocationInterlock:
        if (language != EShLangFragment)
            error(loc, "beginInvocationInterlockARB() must be in a fragment shader", "", "");
        if (! inMain)
            error(loc, "beginInvocationInterlockARB() must be in main()", "", "");
        else if (postEntryPointReturn)
            error(loc, "beginInvocationInterlockARB() cannot be placed after a return from main()", "", "");
        if (controlFlowNestingLevel > 0)
            error(loc, "beginInvocationInterlockARB() cannot be placed within flow control", "", "");

        if (beginInvocationInterlockCount > 0)
            error(loc, "beginInvocationInterlockARB() must only be called once", "", "");
        if (endInvocationInterlockCount > 0)
            error(loc, "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()", "", "");

        beginInvocationInterlockCount++;

        // default to pixel_interlock_ordered
        if (intermediate.getInterlockOrdering() == EioNone)
            intermediate.setInterlockOrdering(EioPixelInterlockOrdered);
        break;
    case EOpEndInvocationInterlock:
        if (language != EShLangFragment)
            error(loc, "endInvocationInterlockARB() must be in a fragment shader", "", "");
        if (! inMain)
            error(loc, "endInvocationInterlockARB() must be in main()", "", "");
        else if (postEntryPointReturn)
            error(loc, "endInvocationInterlockARB() cannot be placed after a return from main()", "", "");
        if (controlFlowNestingLevel > 0)
            error(loc, "endInvocationInterlockARB() cannot be placed within flow control", "", "");

        if (endInvocationInterlockCount > 0)
            error(loc, "endInvocationInterlockARB() must only be called once", "", "");
        if (beginInvocationInterlockCount == 0)
            error(loc, "beginInvocationInterlockARB() must be called before endInvocationInterlockARB()", "", "");

        endInvocationInterlockCount++;
        break;
    default:
        break;
    }
}